

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void cppcms::json::details::generic_append<cppcms::json::details::stream_append>
               (char *begin,char *end,stream_append *a)

{
  byte bVar1;
  undefined8 uVar2;
  byte *in_RSI;
  byte *in_RDI;
  uchar c;
  char *addon;
  char buf [8];
  char *last;
  char *i;
  undefined7 in_stack_ffffffffffffffb8;
  char in_stack_ffffffffffffffbf;
  uint in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  char *local_38;
  undefined1 local_30 [5];
  char cStack_2b;
  undefined1 uStack_29;
  byte *local_28;
  byte *local_20;
  byte *local_10;
  byte *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  stream_append::append
            ((stream_append *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbf);
  _local_30 = 0x3030755c;
  local_20 = local_8;
  local_28 = local_8;
  while (uVar2 = _local_30, local_20 != local_10) {
    local_38 = (char *)0x0;
    bVar1 = *local_20;
    in_stack_ffffffffffffffc4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc4);
    in_stack_ffffffffffffffc0 = (uint)bVar1;
    if (in_stack_ffffffffffffffc0 == 8) {
      local_38 = "\\b";
    }
    else if (in_stack_ffffffffffffffc0 == 9) {
      local_38 = "\\t";
    }
    else if (in_stack_ffffffffffffffc0 == 10) {
      local_38 = "\\n";
    }
    else if (in_stack_ffffffffffffffc0 == 0xc) {
      local_38 = "\\f";
    }
    else if (in_stack_ffffffffffffffc0 == 0xd) {
      local_38 = "\\r";
    }
    else if (in_stack_ffffffffffffffc0 == 0x22) {
      local_38 = "\\\"";
    }
    else if (in_stack_ffffffffffffffc0 == 0x5c) {
      local_38 = "\\\\";
    }
    else if (bVar1 < 0x20) {
      uStack_29 = SUB81(uVar2,7);
      _local_30 = (uint7)CONCAT15("0123456789abcdef"[(int)(bVar1 & 0xf)],
                                  CONCAT14("0123456789abcdef"[(int)(uint)bVar1 >> 4],local_30._0_4_)
                                 );
      local_38 = local_30;
    }
    if (local_38 == (char *)0x0) {
      local_20 = local_20 + 1;
    }
    else {
      stream_append::append
                ((stream_append *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),0x11e3f8);
      stream_append::append
                ((stream_append *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      local_28 = local_20 + 1;
      local_20 = local_28;
    }
  }
  stream_append::append
            ((stream_append *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),0x11e450);
  stream_append::append
            ((stream_append *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbf);
  return;
}

Assistant:

void generic_append(char const *begin,char const *end,Appender &a)
		{
			a.append('"');
			char const *i,*last;
			char buf[8] = "\\u00";
			for(i=begin,last = begin;i!=end;) {
				char const *addon = 0;
				unsigned char c=*i;
				switch(c) {
				case 0x22: addon = "\\\""; break;
				case 0x5C: addon = "\\\\"; break;
				case '\b': addon = "\\b"; break;
				case '\f': addon = "\\f"; break;
				case '\n': addon = "\\n"; break;
				case '\r': addon = "\\r"; break;
				case '\t': addon = "\\t"; break;
				default:
					if(c<=0x1F) {
						static char const tohex[]="0123456789abcdef";
						buf[4]=tohex[c >>  4];
						buf[5]=tohex[c & 0xF];
						buf[6]=0;
						addon = buf;
					}
				};
				if(addon) {
					a.append(last,i-last);
					a.append(addon);
					i++;
					last = i;
				}
				else {
					i++;
				}
			}
			a.append(last,i-last);
			a.append('"');
		}